

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O1

void clear_memory_glyph(schar x,schar y,int to)

{
  rm *prVar1;
  undefined1 *puVar2;
  int iVar3;
  undefined7 in_register_00000031;
  int iVar4;
  undefined7 in_register_00000039;
  
  iVar4 = (int)CONCAT71(in_register_00000039,x);
  iVar3 = (int)CONCAT71(in_register_00000031,y);
  *(uint *)(level->locations[iVar4] + iVar3) =
       *(uint *)(level->locations[iVar4] + iVar3) & 0xffffffc0 | to & 0x3fU;
  prVar1 = level->locations[iVar4] + iVar3;
  *(uint *)prVar1 = *(uint *)prVar1 & 0xfffff83f;
  prVar1 = level->locations[iVar4] + iVar3;
  *(uint *)prVar1 = *(uint *)prVar1 & 0xffe007ff;
  prVar1 = level->locations[iVar4] + iVar3;
  *(uint *)prVar1 = *(uint *)prVar1 & 0xc01fffff;
  prVar1 = level->locations[iVar4] + iVar3;
  *(uint *)prVar1 = *(uint *)prVar1 & 0xbfffffff;
  prVar1 = level->locations[iVar4] + iVar3;
  *(uint *)prVar1 = *(uint *)prVar1 & 0x7fffffff;
  puVar2 = &level->locations[iVar4][iVar3].field_0x6;
  *(uint *)puVar2 = *(uint *)puVar2 & 0xfffffff7;
  puVar2 = &level->locations[iVar4][iVar3].field_0x6;
  *(uint *)puVar2 = *(uint *)puVar2 & 0xfffffffb;
  puVar2 = &level->locations[iVar4][iVar3].field_0x6;
  *(uint *)puVar2 = *(uint *)puVar2 & 0xfffffffe;
  puVar2 = &level->locations[iVar4][iVar3].field_0x6;
  *(uint *)puVar2 = *(uint *)puVar2 & 0xfffffffd;
  return;
}

Assistant:

void clear_memory_glyph(schar x, schar y, int to)
{
    level->locations[x][y].mem_bg = to;
    level->locations[x][y].mem_trap = 0;
    level->locations[x][y].mem_obj = 0;
    level->locations[x][y].mem_obj_mn = 0;
    level->locations[x][y].mem_obj_stacks = 0;
    level->locations[x][y].mem_obj_prize = 0;
    level->locations[x][y].mem_invis = 0;
    level->locations[x][y].mem_stepped = 0;
    level->locations[x][y].mem_door_l = 0;
    level->locations[x][y].mem_door_t = 0;
}